

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char,std::char_traits<char>> *this,allocator<char> *a)

{
  const_iterator __beg;
  const_iterator __end;
  string local_40 [32];
  allocator<char> *local_20;
  allocator<char> *a_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_20 = a;
  a_local = (allocator<char> *)this;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)__return_storage_ptr__;
  __beg = basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  __end = basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::string::string<char_const*>(local_40,__beg,__end,local_20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT, Traits, Allocator>
    to_string( Allocator const & a ) const
    {
        return std::basic_string<CharT, Traits, Allocator>( begin(), end(), a );
    }